

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyformat.h
# Opt level: O0

void tinyformat::format<std::__cxx11::string,unsigned_long>
               (ostream *out,char *fmt,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args,
               unsigned_long *args_1)

{
  FormatListN<2> local_68;
  unsigned_long *local_28;
  unsigned_long *args_local_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_local;
  char *fmt_local;
  ostream *out_local;
  
  local_28 = args_1;
  args_local_1 = (unsigned_long *)args;
  args_local = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)fmt;
  fmt_local = (char *)out;
  makeFormatList<std::__cxx11::string,unsigned_long>
            (&local_68,(tinyformat *)args,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args_1,args_1);
  vformat(out,fmt,&local_68.super_FormatList);
  return;
}

Assistant:

void format(std::ostream& out, const char* fmt, const Args&... args)
{
    vformat(out, fmt, makeFormatList(args...));
}